

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

Object * resolveContainerCall(Object *__return_storage_ptr__,Call c,Environment *env)

{
  char *identifer;
  Object value;
  Instance *pIVar1;
  Object local_d0;
  Object local_90;
  int local_4c;
  Environment *pEStack_48;
  int i;
  Environment *containerEnv;
  Container r;
  Environment *env_local;
  
  r.constructor.statements = (Statement *)env;
  env_container_get((Container *)&containerEnv,c.identifer,c.line,globalEnv);
  if ((uint)r.name == c.argCount) {
    pEStack_48 = env_new(globalEnv);
    for (local_4c = 0; local_4c < (int)(uint)r.name; local_4c = local_4c + 1) {
      identifer = *(char **)(r._16_8_ + (long)local_4c * 8);
      resolveExpression(&local_90,c.arguments[local_4c],(Environment *)r.constructor.statements);
      value.field_1.instance = local_90.field_1.instance;
      value.type = local_90.type;
      value._4_4_ = local_90._4_4_;
      value.field_1._8_8_ = local_90.field_1._8_8_;
      value.field_1._16_8_ = local_90.field_1._16_8_;
      value.field_1.routine.arguments = local_90.field_1.routine.arguments;
      value.field_1._32_8_ = local_90.field_1._32_8_;
      value.field_1.container.constructor.statements =
           local_90.field_1.container.constructor.statements;
      value.field_1.routine.code.statements = local_90.field_1.routine.code.statements;
      env_put(identifer,c.line,value,pEStack_48);
    }
    executeBlock(&local_d0,(Block)r._24_16_,pEStack_48);
    __return_storage_ptr__->type = OBJECT_INSTANCE;
    pIVar1 = (Instance *)malloc(0x20);
    (__return_storage_ptr__->field_1).instance = pIVar1;
    ((__return_storage_ptr__->field_1).instance)->name = (char *)r._0_8_;
    ((__return_storage_ptr__->field_1).instance)->environment = pEStack_48;
    ((__return_storage_ptr__->field_1).instance)->refCount = 0;
    instanceCount = instanceCount + 1;
    ((__return_storage_ptr__->field_1).instance)->insCount = instanceCount;
    ((__return_storage_ptr__->field_1).instance)->fromReturn = 0;
  }
  else {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Argument count mismatch for container %s! Expected : %d Received %d!\x1b[0m"
           ,(ulong)(uint)c.line,c.identifer,(ulong)(uint)r.name,(ulong)(uint)c.argCount);
    stop();
    memcpy(__return_storage_ptr__,&nullObject,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

static Object resolveContainerCall(Call c, Environment *env){
    Container r = env_container_get(c.identifer, c.line, globalEnv);
    //printf("\nResolving call to %s", c.identifer); 
    if(r.arity != c.argCount){
        printf(runtime_error("Argument count mismatch for container %s! Expected : %d Received %d!"), 
                c.line, c.identifer, r.arity, c.argCount);
        stop();
        return nullObject;
    }
    Environment *containerEnv = env_new(globalEnv);
    int i = 0;
    // printf("\n[Call] Executing container %s\n", r.name);
    while(i < r.arity){
        env_put(r.arguments[i], c.line, resolveExpression(c.arguments[i], env), containerEnv);
        i++;
    }
    // printf("\n[Call] Executing %s\n", r.name);
    executeBlock(r.constructor, containerEnv);
    Object o;
    o.type = OBJECT_INSTANCE;
    o.instance = (Instance *)mallocate(sizeof(Instance));
    o.instance->name = r.name;
    o.instance->environment = containerEnv;
    o.instance->refCount = 0;
    o.instance->insCount = ++instanceCount;
    o.instance->fromReturn = 0;
    return o;
}